

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.cpp
# Opt level: O0

Trivia __thiscall
slang::parsing::Preprocessor::handleEndKeywordsDirective(Preprocessor *this,Token directive)

{
  SourceRange range;
  Token directive_00;
  Token directive_01;
  undefined1 auVar1 [14];
  size_type sVar2;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  Trivia TVar3;
  undefined6 in_stack_ffffffffffffff88;
  undefined2 in_stack_ffffffffffffff8e;
  undefined6 in_stack_ffffffffffffff90;
  undefined2 in_stack_ffffffffffffff96;
  SourceLocation in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  DiagCode in_stack_ffffffffffffffa4;
  undefined2 uStack_2;
  
  directive_00.info._0_4_ = in_stack_ffffffffffffffa0;
  directive_00._0_8_ = in_stack_ffffffffffffff98;
  directive_00.info._4_4_ = in_stack_ffffffffffffffa4;
  checkOutsideDesignElement
            ((Preprocessor *)CONCAT26(in_stack_ffffffffffffff96,in_stack_ffffffffffffff90),
             directive_00);
  sVar2 = std::
          vector<slang::parsing::KeywordVersion,_std::allocator<slang::parsing::KeywordVersion>_>::
          size((vector<slang::parsing::KeywordVersion,_std::allocator<slang::parsing::KeywordVersion>_>
                *)(in_RDI + 0x268));
  if (sVar2 == 1) {
    Token::range((Token *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    range.startLoc._6_2_ = in_stack_ffffffffffffff96;
    range.startLoc._0_6_ = in_stack_ffffffffffffff90;
    range.endLoc = in_stack_ffffffffffffff98;
    addDiag((Preprocessor *)CONCAT26(in_stack_ffffffffffffff8e,in_stack_ffffffffffffff88),
            in_stack_ffffffffffffffa4,range);
  }
  else {
    std::vector<slang::parsing::KeywordVersion,_std::allocator<slang::parsing::KeywordVersion>_>::
    pop_back((vector<slang::parsing::KeywordVersion,_std::allocator<slang::parsing::KeywordVersion>_>
              *)0x36b5d3);
  }
  directive_01.info._0_4_ = (int)in_RDX;
  directive_01._0_8_ = in_RSI;
  directive_01.info._4_4_ = (int)((ulong)in_RDX >> 0x20);
  TVar3 = createSimpleDirective
                    ((Preprocessor *)CONCAT26(in_stack_ffffffffffffff96,in_stack_ffffffffffffff90),
                     directive_01);
  auVar1 = TVar3._0_14_;
  TVar3._14_2_ = uStack_2;
  TVar3.field_0 = (anon_union_12_4_39e54f29_for_Trivia_0)auVar1._0_12_;
  TVar3.hasFullLocation = (bool)auVar1[0xc];
  TVar3.kind = auVar1[0xd];
  return TVar3;
}

Assistant:

Trivia Preprocessor::handleEndKeywordsDirective(Token directive) {
    checkOutsideDesignElement(directive);

    if (keywordVersionStack.size() == 1)
        addDiag(diag::MismatchedEndKeywordsDirective, directive.range());
    else
        keywordVersionStack.pop_back();

    return createSimpleDirective(directive);
}